

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

Bool CheckMetaData(TidyDocImpl *doc,Node *node,Bool HasMetaData)

{
  Node *node_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Bool BVar4;
  int iVar5;
  TidyAttrId TVar6;
  Dict *pDVar7;
  ctmbstr ptVar8;
  AttVal *pAVar9;
  Node **ppNVar10;
  
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) {
    return HasMetaData;
  }
  pDVar7 = node->tag;
  if ((pDVar7 == (Dict *)0x0) || (pDVar7->id != TidyTag_META)) {
    if (HasMetaData == no) {
LAB_00151bae:
      if (pDVar7 == (Dict *)0x0) {
LAB_00151bda:
        BVar4 = prvTidynodeIsText(node->content);
        if (BVar4 != no) {
          ptVar8 = textFromOneNode(doc,node->content);
          BVar4 = IsWhitespace(ptVar8);
          if (BVar4 == no) goto LAB_00151c5b;
        }
      }
      else if (pDVar7->id != TidyTag_TITLE) {
        if (((pDVar7->id == TidyTag_ADDRESS) && (node->content != (Node *)0x0)) &&
           ((pDVar7 = node->content->tag, pDVar7 != (Dict *)0x0 && (pDVar7->id == TidyTag_A))))
        goto LAB_00151c5b;
        goto LAB_00151bda;
      }
      BVar4 = no;
      if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_LINK)) ||
         ((pAVar9 = prvTidyAttrGetById(node,TidyAttr_REL), pAVar9 != (AttVal *)0x0 &&
          ((pAVar9->value != (ctmbstr)0x0 &&
           (ptVar8 = prvTidytmbsubstr(pAVar9->value,"stylesheet"), BVar4 = no,
           ptVar8 != (ctmbstr)0x0)))))) goto LAB_00151c5e;
    }
  }
  else {
    pAVar9 = (AttVal *)&node->attributes;
    bVar2 = false;
    bVar1 = false;
    bVar3 = false;
    while (pAVar9 = pAVar9->next, pAVar9 != (AttVal *)0x0) {
      if (pAVar9->dict != (Attribute *)0x0) {
        TVar6 = pAVar9->dict->id;
        if (TVar6 == TidyAttr_HTTP_EQUIV) {
          BVar4 = hasValue(pAVar9);
          if (BVar4 != no) {
            if (pAVar9->value != (ctmbstr)0x0) {
              iVar5 = prvTidytmbstrcasecmp(pAVar9->value,"refresh");
              bVar3 = true;
              if (iVar5 != 0) goto LAB_00151b22;
              prvTidyReportAccessError(doc,node,0x2e5);
              bVar2 = true;
            }
            bVar3 = true;
          }
LAB_00151b22:
          if (pAVar9->dict == (Attribute *)0x0) goto LAB_00151b6d;
          TVar6 = pAVar9->dict->id;
        }
        if ((TVar6 == TidyAttr_CONTENT) && (BVar4 = hasValue(pAVar9), BVar4 != no)) {
          iVar5 = prvTidytmbstrncmp(pAVar9->value,"http:",5);
          if (iVar5 == 0) {
            prvTidyReportAccessError(doc,node,0x2e6);
            bVar1 = true;
          }
          bVar3 = true;
        }
      }
LAB_00151b6d:
      BVar4 = prvTidyIsHTML5Mode(doc);
      if ((((BVar4 != no) && (pAVar9->dict != (Attribute *)0x0)) &&
          (pAVar9->dict->id == TidyAttr_CHARSET)) && (BVar4 = hasValue(pAVar9), BVar4 != no)) {
        bVar3 = true;
      }
    }
    if (bVar1 || bVar2) {
      prvTidyReportAccessError(doc,node,0x309);
    }
    else if (!bVar3 && HasMetaData == no) {
      pDVar7 = node->tag;
      goto LAB_00151bae;
    }
  }
LAB_00151c5b:
  BVar4 = yes;
LAB_00151c5e:
  ppNVar10 = &node->content;
  while (node_00 = *ppNVar10, node_00 != (Node *)0x0) {
    BVar4 = CheckMetaData(doc,node_00,BVar4);
    ppNVar10 = &node_00->next;
  }
  return BVar4;
}

Assistant:

static Bool CheckMetaData( TidyDocImpl* doc, Node* node, Bool HasMetaData )
{
    Bool HasHttpEquiv = no;
    Bool HasContent = no;
    Bool ContainsAttr = no;

    if (Level2_Enabled( doc ))
    {
        if ( nodeIsMETA(node) )
        {
            AttVal* av;
            for (av = node->attributes; av != NULL; av = av->next)
            {
                if ( attrIsHTTP_EQUIV(av) && hasValue(av) )
                {
                    ContainsAttr = yes;

                    /* Must not have an auto-refresh */
                    if (AttrValueIs(av, "refresh"))
                    {
                        HasHttpEquiv = yes;
                        TY_(ReportAccessError)( doc, node, REMOVE_AUTO_REFRESH );
                    }
                }

                if ( attrIsCONTENT(av) && hasValue(av) )
                {
                    ContainsAttr = yes;

                    /* If the value is not an integer, then it must not be a URL */
                    if ( TY_(tmbstrncmp)(av->value, "http:", 5) == 0)
                    {
                        HasContent = yes;
                        TY_(ReportAccessError)( doc, node, REMOVE_AUTO_REDIRECT);
                    }
                }
                if (TY_(IsHTML5Mode)(doc) && attrIsCHARSET(av) && hasValue(av))
                {
                    ContainsAttr = yes;
                }
            }
        
            if ( HasContent || HasHttpEquiv )
            {
                HasMetaData = yes;
                TY_(ReportAccessError)( doc, node, METADATA_MISSING_REDIRECT_AUTOREFRESH);
            }
            else
            {
                if ( ContainsAttr && !HasContent && !HasHttpEquiv )
                    HasMetaData = yes;                    
            }
        }

        if ( !HasMetaData && 
             nodeIsADDRESS(node) &&
             nodeIsA(node->content) )
        {
            HasMetaData = yes;
        }
            
        if ( !HasMetaData &&
             !nodeIsTITLE(node) &&
             TY_(nodeIsText)(node->content) )
        {
            ctmbstr word = textFromOneNode( doc, node->content );
            if ( !IsWhitespace(word) )
                HasMetaData = yes;
        }

        if( !HasMetaData && nodeIsLINK(node) )
        {
            AttVal* av = attrGetREL(node);
            if( !AttrContains(av, "stylesheet") )
                HasMetaData = yes;
        }
            
        /* Check for MetaData */
        for ( node = node->content; node; node = node->next )
        {
            HasMetaData = CheckMetaData( doc, node, HasMetaData );
        }
    }
    return HasMetaData;
}